

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void __thiscall Fossilize::StateReplayer::Impl::copy_handle_references(Impl *this,Impl *other)

{
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->replayed_samplers)._M_h,&(other->replayed_samplers)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->replayed_descriptor_set_layouts)._M_h,
              &(other->replayed_descriptor_set_layouts)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->replayed_pipeline_layouts)._M_h,&(other->replayed_pipeline_layouts)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->replayed_shader_modules)._M_h,&(other->replayed_shader_modules)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->replayed_render_passes)._M_h,&(other->replayed_render_passes)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->replayed_compute_pipelines)._M_h,&(other->replayed_compute_pipelines)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->replayed_graphics_pipelines)._M_h,&(other->replayed_graphics_pipelines)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->replayed_raytracing_pipelines)._M_h,
              &(other->replayed_raytracing_pipelines)._M_h);
  return;
}

Assistant:

void StateReplayer::Impl::copy_handle_references(const StateReplayer::Impl &other)
{
	replayed_samplers = other.replayed_samplers;
	replayed_descriptor_set_layouts = other.replayed_descriptor_set_layouts;
	replayed_pipeline_layouts = other.replayed_pipeline_layouts;
	replayed_shader_modules = other.replayed_shader_modules;
	replayed_render_passes = other.replayed_render_passes;
	replayed_compute_pipelines = other.replayed_compute_pipelines;
	replayed_graphics_pipelines = other.replayed_graphics_pipelines;
	replayed_raytracing_pipelines = other.replayed_raytracing_pipelines;
}